

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O3

void __thiscall
QPDF::writeJSON(QPDF *this,int version,Pipeline *p,bool complete,bool *first_key,
               qpdf_stream_decode_level_e decode_level,qpdf_json_stream_data_e json_stream_data,
               string *file_prefix,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               wanted_objects)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *__v;
  undefined4 uVar2;
  QPDF *this_00;
  char cVar3;
  bool bVar4;
  __index_type _Var5;
  size_t __val;
  long *plVar6;
  const_iterator cVar7;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar8;
  runtime_error *this_01;
  undefined7 in_register_00000009;
  size_t sVar9;
  size_type *psVar10;
  pointer this_02;
  char cVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  string __str;
  Writer jw;
  string __str_1;
  string local_98;
  undefined4 local_78;
  uint local_74;
  QPDF *local_70;
  long local_68;
  QPDFObjGen og;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_48;
  
  if (version != 2) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"QPDF::writeJSON: only version 2 is supported");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  jw.first = true;
  jw.indent = 8;
  jw.p = p;
  if (complete) {
    pcVar12 = "{";
LAB_0020fdfd:
    (*p->_vptr_Pipeline[2])(p,pcVar12,1);
  }
  else if (*first_key == false) {
    pcVar12 = ",";
    goto LAB_0020fdfd;
  }
  *first_key = false;
  (*p->_vptr_Pipeline[2])(p,"\n  \"qpdf\": [\n    {\n      \"jsonversion\": ",0x28);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str,'\x01');
  *__str._M_dataplus._M_p = '2';
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,__str._M_dataplus._M_p,__str._M_string_length);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,",\n      \"pdfversion\": \"",0x17);
  getPDFVersion_abi_cxx11_(&local_98,this);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,local_98._M_dataplus._M_p,local_98._M_string_length);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\",\n      \"pushedinheritedpageresources\": ",0x29);
  bVar4 = everPushedInheritedAttributesToPages(this);
  pcVar12 = "false";
  pcVar13 = "false";
  if (bVar4) {
    pcVar13 = "true";
  }
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,pcVar13,(ulong)bVar4 ^ 5);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,",\n      \"calledgetallpages\": ",0x1d);
  bVar4 = everCalledGetAllPages(this);
  if (bVar4) {
    pcVar12 = "true";
  }
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,pcVar12,(ulong)bVar4 ^ 5);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,",\n      \"maxobjectid\": ",0x17);
  __val = getObjectCount(this);
  cVar11 = '\x01';
  if (9 < __val) {
    sVar9 = __val;
    cVar3 = '\x04';
    do {
      cVar11 = cVar3;
      if (sVar9 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_0020ff92;
      }
      if (sVar9 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_0020ff92;
      }
      if (sVar9 < 10000) goto LAB_0020ff92;
      bVar4 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar3 = cVar11 + '\x04';
    } while (bVar4);
    cVar11 = cVar11 + '\x01';
  }
LAB_0020ff92:
  __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str_1,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,__val);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,__str_1._M_dataplus._M_p,__str_1._M_string_length);
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n    },\n    {",0xd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_78 = (undefined4)CONCAT71(in_register_00000009,complete);
  local_70 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  local_68 = *(long *)(wanted_objects._M_t._M_impl._0_8_ + 0x28);
  getAllObjects(&local_48,local_70);
  if (local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar14 = 1;
  }
  else {
    uVar14 = CONCAT71(wanted_objects._M_t._M_impl._1_7_,1);
    this_02 = local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      og = QPDFObjectHandle::getObjGen(this_02);
      QPDFObjGen::unparse_abi_cxx11_(&__str_1,&og,' ');
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,0x265909);
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_98.field_2._M_allocated_capacity = *psVar10;
        local_98.field_2._8_8_ = plVar6[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar10;
        local_98._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_98._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      psVar10 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar10) {
        __str.field_2._M_allocated_capacity = *psVar10;
        __str.field_2._8_8_ = plVar6[3];
      }
      else {
        __str.field_2._M_allocated_capacity = *psVar10;
        __str._M_dataplus._M_p = (pointer)*plVar6;
      }
      __str._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      if ((local_68 == 0) ||
         (cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)wanted_objects._M_t._M_impl._0_8_,&__str),
         cVar7._M_node != (_Base_ptr)(wanted_objects._M_t._M_impl._0_8_ + 8))) {
        if ((uVar14 & 1) == 0) {
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n      },\n      \"",0x11);
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,__str._M_dataplus._M_p,__str._M_string_length);
        }
        else {
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n      \"",8);
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,__str._M_dataplus._M_p,__str._M_string_length);
          uVar14 = 0;
        }
        __v = (this_02->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (__v == (element_type *)0x0) {
LAB_002102a9:
          __str_1._M_dataplus._M_p = (pointer)0x0;
          __str_1._M_string_length = 0;
LAB_002102b1:
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\": {\n        \"value\": ",0x16);
          QPDFObjectHandle::writeJSON(this_02,2,&jw,true);
        }
        else {
          _Var5 = (__v->value).
                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  ._M_index;
          if (_Var5 == '\x0f') {
            pvVar8 = std::
                     get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                               (&__v->value);
LAB_00210273:
            _Var5 = (((pvVar8->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->value).
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ._M_index;
          }
          else if (_Var5 == '\r') {
            pvVar8 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                      *)resolve(__v->qpdf,*(QPDFObjGen *)&(__v->og).obj);
            goto LAB_00210273;
          }
          if (_Var5 != '\n') goto LAB_002102a9;
          __str_1._M_dataplus._M_p =
               (pointer)(this_02->super_BaseHandle).obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          __str_1._M_string_length =
               (size_type)
               (this_02->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str_1._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str_1._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             __str_1._M_string_length)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str_1._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             __str_1._M_string_length)->_M_use_count + 1;
            }
          }
          if ((element_type *)__str_1._M_dataplus._M_p == (element_type *)0x0) goto LAB_002102b1;
          (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\": {\n        \"stream\": ",0x17);
          if (json_stream_data == qpdf_sj_file) {
            writeJSONStreamFile(2,&jw,(Stream *)&__str_1,og.obj,decode_level,file_prefix);
          }
          else {
            local_74 = (uint)uVar14;
            local_98._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
            ::qpdf::Stream::writeStreamJSON
                      ((Stream *)&__str_1,2,&jw,json_stream_data,decode_level,(Pipeline *)0x0,
                       &local_98,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != paVar1) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            uVar14 = (ulong)local_74;
          }
        }
        if (__str_1._M_string_length != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str_1._M_string_length);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      this_02 = this_02 + 1;
    } while (this_02 !=
             local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_48);
  this_00 = local_70;
  uVar2 = local_78;
  if (local_68 == 0) {
LAB_00210483:
    if ((uVar14 & 1) == 0) {
      (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n      },",9);
    }
    (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n      \"trailer\": {\n        \"value\": ",0x25);
    getTrailer(this_00);
    QPDFObjectHandle::writeJSON((QPDFObjectHandle *)&__str,2,&jw,true);
    if (__str._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str._M_string_length);
    }
  }
  else {
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"trailer","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)wanted_objects._M_t._M_impl._0_8_,&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if (cVar7._M_node != (_Base_ptr)(wanted_objects._M_t._M_impl._0_8_ + 8)) goto LAB_00210483;
    if ((uVar14 & 1) != 0) goto LAB_00210505;
  }
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n      }",8);
LAB_00210505:
  (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n    }\n  ]",10);
  if ((char)uVar2 != '\0') {
    (*(jw.p)->_vptr_Pipeline[2])(jw.p,"\n}\n",3);
    (*p->_vptr_Pipeline[3])(p);
  }
  return;
}

Assistant:

void
QPDF::writeJSON(
    int version,
    Pipeline* p,
    bool complete,
    bool& first_key,
    qpdf_stream_decode_level_e decode_level,
    qpdf_json_stream_data_e json_stream_data,
    std::string const& file_prefix,
    std::set<std::string> wanted_objects)
{
    if (version != 2) {
        throw std::runtime_error("QPDF::writeJSON: only version 2 is supported");
    }
    JSON::Writer jw{p, 4};
    if (complete) {
        jw << "{";
    } else if (!first_key) {
        jw << ",";
    }
    first_key = false;

    /* clang-format off */
    jw << "\n"
          "  \"qpdf\": [\n"
          "    {\n"
          "      \"jsonversion\": " << std::to_string(version) << ",\n"
          "      \"pdfversion\": \"" << getPDFVersion() << "\",\n"
          "      \"pushedinheritedpageresources\": " <<  (everPushedInheritedAttributesToPages() ? "true" : "false") << ",\n"
          "      \"calledgetallpages\": " <<  (everCalledGetAllPages() ? "true" : "false") << ",\n"
          "      \"maxobjectid\": " <<  std::to_string(getObjectCount()) << "\n"
          "    },\n"
          "    {";
    /* clang-format on */

    bool all_objects = wanted_objects.empty();
    bool first = true;
    for (auto& obj: getAllObjects()) {
        auto const og = obj.getObjGen();
        std::string key = "obj:" + og.unparse(' ') + " R";
        if (all_objects || wanted_objects.count(key)) {
            if (first) {
                jw << "\n      \"" << key;
                first = false;
            } else {
                jw << "\n      },\n      \"" << key;
            }
            if (auto stream = obj.as_stream()) {
                jw << "\": {\n        \"stream\": ";
                if (json_stream_data == qpdf_sj_file) {
                    writeJSONStreamFile(
                        version, jw, stream, og.getObj(), decode_level, file_prefix);
                } else {
                    stream.writeStreamJSON(
                        version, jw, json_stream_data, decode_level, nullptr, "");
                }
            } else {
                jw << "\": {\n        \"value\": ";
                obj.writeJSON(version, jw, true);
            }
        }
    }
    if (all_objects || wanted_objects.count("trailer")) {
        if (!first) {
            jw << "\n      },";
        }
        jw << "\n      \"trailer\": {\n        \"value\": ";
        getTrailer().writeJSON(version, jw, true);
        first = false;
    }
    if (!first) {
        jw << "\n      }";
    }
    /* clang-format off */
    jw << "\n"
          "    }\n"
          "  ]";
    /* clang-format on */
    if (complete) {
        jw << "\n}\n";
        p->finish();
    }
}